

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.h
# Opt level: O3

void __thiscall wallet::CCrypter::CleanKey(CCrypter *this)

{
  long lVar1;
  pointer puVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (this->vchKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  memory_cleanse(puVar2,(long)(this->vchKey).
                              super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
  puVar2 = (this->vchIV).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  memory_cleanse(puVar2,(long)(this->vchIV).
                              super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
  this->fKeySet = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CleanKey()
    {
        memory_cleanse(vchKey.data(), vchKey.size());
        memory_cleanse(vchIV.data(), vchIV.size());
        fKeySet = false;
    }